

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O2

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize
          (HungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  pointer pvVar1;
  pointer pfVar2;
  future<double> *handle;
  pointer this_00;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double local_80;
  vector<std::future<double>,_std::allocator<std::future<double>_>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  future<double> local_40;
  
  local_78.super__Vector_base<std::future<double>,_std::allocator<std::future<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (future<double> *)0x0;
  local_78.super__Vector_base<std::future<double>,_std::allocator<std::future<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (future<double> *)0x0;
  local_78.super__Vector_base<std::future<double>,_std::allocator<std::future<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = 0;
  for (uVar3 = 0;
      pfVar2 = local_78.
               super__Vector_base<std::future<double>,_std::allocator<std::future<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
      uVar3 < ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->data_
              ->problemGraph->numberOfFrames_ - 1; uVar3 = uVar3 + 1) {
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)optimizeStep;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar1 = (this->partitions_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::
    async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
              ((launch)&local_40,
               (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x1,
               (HungarianBranching<lineage::heuristics::PartitionGraph> **)
               &local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish,&local_58,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data + lVar4),
               (bool *)((long)&pvVar1[1].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + lVar4));
    std::vector<std::future<double>,std::allocator<std::future<double>>>::
    emplace_back<std::future<double>>
              ((vector<std::future<double>,std::allocator<std::future<double>>> *)&local_78,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___basic_future<double>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar4 = lVar4 + 0x18;
  }
  local_80 = 0.0;
  for (this_00 = local_78.
                 super__Vector_base<std::future<double>,_std::allocator<std::future<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pfVar2; this_00 = this_00 + 1)
  {
    dVar5 = std::future<double>::get(this_00);
    local_80 = local_80 + dVar5;
  }
  std::vector<std::future<double>,_std::allocator<std::future<double>_>_>::~vector(&local_78);
  return local_80;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimize()
{
    auto handles = std::vector<std::future<double>>();
    for (size_t frame = 0;
         frame < this->graph_.data_.problemGraph.numberOfFrames() - 1;
         ++frame) {
        handles.emplace_back(std::async(
            std::launch::async, &HungarianBranching<GRAPH>::optimizeStep, this,
            partitions_[frame], partitions_[frame + 1], true));
    }

    double objective = .0;
    for (auto& handle : handles)
        objective += handle.get();

    return objective;
}